

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void slang::ast::GenvarSymbol::fromSyntax
               (Scope *parent,GenvarDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::GenvarSymbol_*> *results)

{
  size_t sVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  IdentifierNameSyntax *pIVar2;
  Symbol *this;
  string_view sVar3;
  const_iterator __begin2;
  GenvarSymbol *genvar;
  Token name;
  iterator_base<const_slang::syntax::IdentifierNameSyntax_*> local_88;
  Compilation *local_78;
  Scope *local_70;
  SmallVectorBase<const_slang::ast::GenvarSymbol_*> *local_68;
  SourceLocation local_60;
  string_view local_58;
  Token local_48;
  
  local_78 = parent->compilation;
  local_88.index = 0;
  sVar1 = (syntax->identifiers).elements._M_extent._M_extent_value;
  local_88.list = &syntax->identifiers;
  local_70 = parent;
  local_68 = results;
  for (; (local_88.list != &syntax->identifiers || (local_88.index != sVar1 + 1 >> 1));
      local_88.index = local_88.index + 1) {
    pIVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
             iterator_base<const_slang::syntax::IdentifierNameSyntax_*>::dereference(&local_88);
    local_48.kind = (pIVar2->identifier).kind;
    local_48._2_1_ = (pIVar2->identifier).field_0x2;
    local_48.numFlags.raw = (pIVar2->identifier).numFlags.raw;
    local_48.rawLen = (pIVar2->identifier).rawLen;
    local_48.info = (pIVar2->identifier).info;
    sVar3 = parsing::Token::valueText(&local_48);
    if (sVar3._M_len != 0) {
      local_58 = parsing::Token::valueText(&local_48);
      local_60 = parsing::Token::location(&local_48);
      this = &BumpAllocator::
              emplace<slang::ast::GenvarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                        (&local_78->super_BumpAllocator,&local_58,&local_60)->super_Symbol;
      local_58._M_len = (size_t)this;
      this->originatingSyntax = (SyntaxNode *)pIVar2;
      syntax_00._M_ptr =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes(this,local_70,syntax_00);
      SmallVectorBase<slang::ast::GenvarSymbol_const*>::
      emplace_back<slang::ast::GenvarSymbol_const*const&>
                ((SmallVectorBase<slang::ast::GenvarSymbol_const*> *)local_68,
                 (GenvarSymbol **)&local_58);
    }
  }
  return;
}

Assistant:

void GenvarSymbol::fromSyntax(const Scope& parent, const GenvarDeclarationSyntax& syntax,
                              SmallVectorBase<const GenvarSymbol*>& results) {
    auto& comp = parent.getCompilation();
    for (auto id : syntax.identifiers) {
        auto name = id->identifier;
        if (name.valueText().empty())
            continue;

        auto genvar = comp.emplace<GenvarSymbol>(name.valueText(), name.location());
        genvar->setSyntax(*id);
        genvar->setAttributes(parent, syntax.attributes);
        results.push_back(genvar);
    }
}